

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::CollectSiteEdges(S2Builder *this,S2PointIndex<int> *site_index)

{
  long lVar1;
  s2textformat *this_00;
  s2textformat *this_01;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  PointData *pPVar6;
  pointer pRVar7;
  pointer pVVar8;
  int iVar9;
  pointer ppVar10;
  ostream *poVar11;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar12;
  iterator pvVar13;
  long lVar14;
  S2Point *point;
  S2Point *point_00;
  compact_array_base<int,_std::allocator<int>_> *this_02;
  S2Builder *this_03;
  ulong uVar15;
  Result *result;
  pointer pRVar16;
  const_iterator cVar17;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQueryEdgeTarget target;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  local_498;
  S2Builder *local_480;
  undefined **local_478;
  undefined **local_470;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *local_468;
  long local_460;
  pointer local_458;
  ulong local_450;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_448;
  string local_440;
  string local_420;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  S2ClosestPointQueryOptions local_3e8;
  Options local_3c8;
  S2ClosestPointQueryBase<S2MinDistance,_int> local_3a8;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3e8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,0.0);
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._0_5_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._5_3_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_ = 0x7fffffff;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_ = false;
  local_480 = this;
  S2ClosestPointQueryOptions::set_conservative_max_distance
            (&local_3e8,(S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_420,0.0);
  local_3c8.max_error_.length2_._0_5_ = SUB85(local_420._M_dataplus._M_p,0);
  local_3c8.max_error_.length2_._5_3_ = (undefined3)((ulong)local_420._M_dataplus._M_p >> 0x28);
  local_3c8.region_._0_5_ = 0;
  local_3c8.region_._5_3_ = 0;
  local_3c8.max_results_ = 0x7fffffff;
  local_3c8.use_brute_force_ = false;
  S2ClosestPointQueryBase<S2MinDistance,_int>::S2ClosestPointQueryBase(&local_3a8);
  local_3c8.region_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_;
  local_3c8.region_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_;
  local_3c8.max_results_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_;
  local_3c8.use_brute_force_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_;
  local_3c8.max_distance_.super_S1ChordAngle.length2_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_distance_.
       super_S1ChordAngle.length2_;
  local_3c8.max_error_.length2_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_;
  local_3c8.max_error_.length2_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_;
  local_3a8.index_ = site_index;
  local_3a8.iter_.map_ = &site_index->map_;
  local_3a8.iter_.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)site_index);
  local_3a8.iter_.iter_.position = 0;
  cVar17 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                  *)local_3a8.iter_.map_);
  this_03 = local_480;
  local_3a8.iter_.end_.node = cVar17.node;
  local_3a8.iter_.end_.position = cVar17.position;
  if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_498.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468 = &local_480->edge_sites_;
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::resize(local_468,
           (long)(local_480->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_480->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar10 = (this_03->input_edges_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this_03->input_edges_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar10) {
    uVar15 = 0;
    local_470 = &PTR__S2DistanceTarget_002c2a10;
    local_478 = &PTR__S2DistanceTarget_002c1d08;
    do {
      iVar5 = ppVar10[uVar15].first;
      local_458 = (this_03->input_vertices_).
                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                  super__Vector_impl_data._M_start;
      this_00 = (s2textformat *)(local_458 + iVar5);
      iVar9 = ppVar10[uVar15].second;
      this_01 = (s2textformat *)(local_458 + iVar9);
      if (s2builder_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2Polyline: ",0xc)
        ;
        s2textformat::ToString_abi_cxx11_(&local_420,this_00,point);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_420._M_dataplus._M_p,
                             local_420._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        s2textformat::ToString_abi_cxx11_(&local_440,this_01,point_00);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_440._M_dataplus._M_p,local_440._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p);
        }
      }
      local_420.field_2._8_8_ = *(undefined8 *)(this_00 + 0x10);
      local_420._M_string_length = *(size_type *)this_00;
      local_420.field_2._M_allocated_capacity = *(undefined8 *)(this_00 + 8);
      local_3f0 = *(undefined8 *)(this_01 + 0x10);
      local_400 = *(undefined8 *)this_01;
      uStack_3f8 = *(undefined8 *)(this_01 + 8);
      local_420._M_dataplus._M_p = (pointer)local_478;
      S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPoints
                (&local_3a8,(Target *)&local_420,&local_3c8,&local_498);
      this_02 = &(local_468->
                 super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar15].
                 super_compact_array_base<int,_std::allocator<int>_>;
      local_460 = (long)iVar9 * 3;
      local_450 = uVar15;
      gtl::compact_array_base<int,_std::allocator<int>_>::reallocate
                (this_02,(size_type_conflict)
                         ((ulong)((long)local_498.
                                        super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_498.
                                       super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4));
      pVVar8 = local_458;
      pRVar7 = local_498.
               super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_498.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_498.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_448 = &this_02->field_7;
        lVar1 = local_460 * 8;
        pRVar16 = local_498.
                  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          paVar12 = local_448;
          if (this_02->is_inlined_ == false) {
            paVar12 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                       *)(this_02->field_7).pointer_;
          }
          pPVar6 = pRVar16->point_data_;
          pvVar13 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                              (this_02,(const_iterator)
                                       ((long)paVar12 + (ulong)(*(uint *)this_02 & 0xffffff) * 4),1)
          ;
          this_03 = local_480;
          *pvVar13 = (pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                     super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          if ((local_480->snapping_needed_ == false) &&
             (dVar3 = (local_480->min_edge_site_separation_ca_limit_).length2_,
             (pRVar16->distance_).super_S1ChordAngle.length2_ <= dVar3 &&
             dVar3 != (pRVar16->distance_).super_S1ChordAngle.length2_)) {
            pPVar6 = pRVar16->point_data_;
            dVar3 = (pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                    super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
            if ((dVar3 == *(double *)this_00) && (!NAN(dVar3) && !NAN(*(double *)this_00))) {
              lVar14 = 0;
              do {
                if (lVar14 == 0x10) goto LAB_001acc50;
                dVar4 = *(double *)
                         ((long)(pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_ +
                         lVar14 + 8);
                pdVar2 = (double *)((long)pVVar8[iVar5].c_ + lVar14 + 8);
                lVar14 = lVar14 + 8;
              } while ((dVar4 == *pdVar2) && (!NAN(dVar4) && !NAN(*pdVar2)));
            }
            if ((dVar3 == *(double *)this_01) && (!NAN(dVar3) && !NAN(*(double *)this_01))) {
              lVar14 = 0;
              do {
                if (lVar14 == 0x10) goto LAB_001acc50;
                dVar3 = *(double *)
                         ((long)(pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_ +
                         lVar14 + 8);
                pdVar2 = (double *)((long)pVVar8->c_ + lVar14 + lVar1 + 8);
                lVar14 = lVar14 + 8;
              } while ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2)));
            }
            iVar9 = s2pred::CompareEdgeDistance
                              (&(pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl,
                               (S2Point *)this_00,(S2Point *)this_01,
                               (S1ChordAngle)(local_480->min_edge_site_separation_ca_).length2_);
            if (iVar9 < 0) {
              this_03->snapping_needed_ = true;
            }
          }
LAB_001acc50:
          pRVar16 = pRVar16 + 1;
        } while (pRVar16 != pRVar7);
      }
      SortSitesByDistance(this_03,(S2Point *)this_00,
                          (compact_array<int,_std::allocator<int>_> *)this_02);
      uVar15 = local_450 + 1;
      ppVar10 = (this_03->input_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this_03->input_edges_).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 3)
            );
  }
  if (local_498.
      super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.
                    super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&local_3a8);
  return;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}